

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

Memory google::protobuf::internal::AllocateMemory
                 (AllocationPolicy *policy_ptr,size_t last_size,size_t min_bytes)

{
  Memory MVar1;
  ArenaMetricsCollector *pAVar2;
  unsigned_long *puVar3;
  unsigned_long uVar4;
  LogMessage *other;
  void *local_d0;
  void *mem;
  LogFinisher local_bd [20];
  byte local_a9;
  LogMessage local_a8;
  unsigned_long local_70;
  size_t local_68;
  size_t max_size;
  size_t size;
  AllocationPolicy policy;
  size_t min_bytes_local;
  size_t last_size_local;
  AllocationPolicy *policy_ptr_local;
  
  policy.metrics_collector = (ArenaMetricsCollector *)min_bytes;
  AllocationPolicy::AllocationPolicy((AllocationPolicy *)&size);
  if (policy_ptr != (AllocationPolicy *)0x0) {
    memcpy(&size,policy_ptr,0x28);
  }
  if (last_size == 0) {
    max_size = size;
  }
  else {
    local_68 = policy.start_block_size;
    local_70 = last_size << 1;
    puVar3 = std::min<unsigned_long>(&local_70,&local_68);
    max_size = *puVar3;
  }
  pAVar2 = policy.metrics_collector;
  uVar4 = std::numeric_limits<unsigned_long>::max();
  local_a9 = 0;
  if ((ArenaMetricsCollector *)(uVar4 - 0x18) < pAVar2) {
    LogMessage::LogMessage
              (&local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena.cc"
               ,0x43);
    local_a9 = 1;
    other = LogMessage::operator<<
                      (&local_a8,
                       "CHECK failed: (min_bytes) <= (std::numeric_limits<size_t>::max() - SerialArena::kBlockHeaderSize): "
                      );
    LogFinisher::operator=(local_bd,other);
  }
  if ((local_a9 & 1) != 0) {
    LogMessage::~LogMessage(&local_a8);
  }
  mem = policy.metrics_collector + 0x18;
  puVar3 = std::max<unsigned_long>(&max_size,(unsigned_long *)&mem);
  max_size = *puVar3;
  if (policy.max_block_size == 0) {
    local_d0 = operator_new(max_size);
  }
  else {
    local_d0 = (void *)(*(code *)policy.max_block_size)(max_size);
  }
  MVar1.size = max_size;
  MVar1.ptr = local_d0;
  return MVar1;
}

Assistant:

static SerialArena::Memory AllocateMemory(const AllocationPolicy* policy_ptr,
                                          size_t last_size, size_t min_bytes) {
  AllocationPolicy policy;  // default policy
  if (policy_ptr) policy = *policy_ptr;
  size_t size;
  if (last_size != 0) {
    // Double the current block size, up to a limit.
    auto max_size = policy.max_block_size;
    size = std::min(2 * last_size, max_size);
  } else {
    size = policy.start_block_size;
  }
  // Verify that min_bytes + kBlockHeaderSize won't overflow.
  GOOGLE_CHECK_LE(min_bytes,
           std::numeric_limits<size_t>::max() - SerialArena::kBlockHeaderSize);
  size = std::max(size, SerialArena::kBlockHeaderSize + min_bytes);

  void* mem;
  if (policy.block_alloc == nullptr) {
    mem = ::operator new(size);
  } else {
    mem = policy.block_alloc(size);
  }
  return {mem, size};
}